

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O0

uint32_t __thiscall spvtools::opt::analysis::ScalarConstant::GetU32BitValue(ScalarConstant *this)

{
  int iVar1;
  undefined4 extraout_var;
  size_type sVar2;
  undefined4 extraout_var_00;
  const_reference pvVar3;
  ScalarConstant *this_local;
  
  iVar1 = (*(this->super_Constant)._vptr_Constant[0x18])();
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     CONCAT44(extraout_var,iVar1));
  if (sVar2 == 1) {
    iVar1 = (*(this->super_Constant)._vptr_Constant[0x18])();
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        CONCAT44(extraout_var_00,iVar1),0);
    return *pvVar3;
  }
  __assert_fail("words().size() == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/constants.h"
                ,0xa9,"uint32_t spvtools::opt::analysis::ScalarConstant::GetU32BitValue() const");
}

Assistant:

uint32_t GetU32BitValue() const {
    // Relies on unsigned values smaller than 32-bit being zero extended.  See
    // section 2.2.1 of the SPIR-V spec.
    assert(words().size() == 1);
    return words()[0];
  }